

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyDieRanges(DWARFVerifier *this,DWARFDie *Die,DieRangeInfo *ParentRI)

{
  size_t *this_00;
  bool bVar1;
  bool bVar2;
  Tag TVar3;
  uint uVar4;
  reference __x;
  reference pDVar5;
  reference R;
  pointer Die_00;
  raw_ostream *prVar6;
  DWARFDie *pDVar7;
  iterator iVar8;
  DWARFDie DVar9;
  undefined1 auStack_188 [8];
  DWARFDie Child;
  iterator __end1;
  iterator __begin1;
  DWARFDie *__range1;
  iterator iStack_148;
  bool ShouldBeContained;
  _Self local_140;
  die_range_info_iterator IntersectingChild;
  __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  local_130;
  address_range_iterator IntersectingRange;
  DWARFAddressRange Range;
  iterator __end2;
  iterator __begin2;
  DWARFAddressRangesVector *__range2;
  undefined1 local_e0 [8];
  DieRangeInfo RI;
  DWARFAddressRangesVector Ranges;
  undefined1 local_68 [24];
  undefined1 local_50 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  uint NumErrors;
  DieRangeInfo *ParentRI_local;
  DWARFDie *Die_local;
  DWARFVerifier *this_local;
  
  RangesOrError._28_4_ = 0;
  bVar1 = DWARFDie::isValid(Die);
  if (bVar1) {
    DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)local_50,Die);
    bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_50);
    if (bVar1) {
      __x = Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
            ::get((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                   *)local_50);
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 &RI.Children._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
      DieRangeInfo::DieRangeInfo((DieRangeInfo *)local_e0,*Die);
      if ((((this->IsObjectFile & 1U) == 0) || ((this->IsMachOObject & 1U) != 0)) ||
         (TVar3 = DWARFDie::getTag(Die), TVar3 != DW_TAG_compile_unit)) {
        this_00 = &RI.Children._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end2 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
                 begin((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                       this_00);
        Range.SectionIndex =
             (uint64_t)
             std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                       ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *
                        )this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                                           *)&Range.SectionIndex), bVar1) {
          pDVar5 = __gnu_cxx::
                   __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                   ::operator*(&__end2);
          Range.HighPC = pDVar5->SectionIndex;
          IntersectingRange._M_current = (DWARFAddressRange *)pDVar5->LowPC;
          Range.LowPC = pDVar5->HighPC;
          bVar1 = DWARFAddressRange::valid((DWARFAddressRange *)&IntersectingRange);
          if (bVar1) {
            local_130._M_current =
                 (DWARFAddressRange *)
                 DieRangeInfo::insert
                           ((DieRangeInfo *)local_e0,(DWARFAddressRange *)&IntersectingRange);
            IntersectingChild._M_node =
                 (_Base_ptr)
                 std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                           ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                             *)&RI.Die.Die);
            bVar1 = __gnu_cxx::operator!=
                              (&local_130,
                               (__normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                                *)&IntersectingChild);
            if (bVar1) {
              RangesOrError._28_4_ = RangesOrError._28_4_ + 1;
              prVar6 = error(this);
              prVar6 = raw_ostream::operator<<(prVar6,"DIE has overlapping address ranges: ");
              prVar6 = llvm::operator<<(prVar6,(DWARFAddressRange *)&IntersectingRange);
              prVar6 = raw_ostream::operator<<(prVar6," and ");
              R = __gnu_cxx::
                  __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                  ::operator*(&local_130);
              prVar6 = llvm::operator<<(prVar6,R);
              raw_ostream::operator<<(prVar6,"\n");
              break;
            }
          }
          else {
            RangesOrError._28_4_ = RangesOrError._28_4_ + 1;
            prVar6 = error(this);
            prVar6 = raw_ostream::operator<<(prVar6,"Invalid address range ");
            prVar6 = llvm::operator<<(prVar6,(DWARFAddressRange *)&IntersectingRange);
            raw_ostream::operator<<(prVar6,"\n");
          }
          __gnu_cxx::
          __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
          ::operator++(&__end2);
        }
      }
      local_140._M_node = (_Base_ptr)DieRangeInfo::insert(ParentRI,(DieRangeInfo *)local_e0);
      iStack_148 = std::
                   set<llvm::DWARFVerifier::DieRangeInfo,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
                   ::end(&ParentRI->Children);
      bVar1 = std::operator!=(&local_140,&stack0xfffffffffffffeb8);
      if (bVar1) {
        RangesOrError._28_4_ = RangesOrError._28_4_ + 1;
        prVar6 = error(this);
        raw_ostream::operator<<(prVar6,"DIEs have overlapping address ranges:");
        dump(this,Die,0);
        Die_00 = std::_Rb_tree_const_iterator<llvm::DWARFVerifier::DieRangeInfo>::operator->
                           (&local_140);
        prVar6 = dump(this,&Die_00->Die,0);
        raw_ostream::operator<<(prVar6,'\n');
      }
      bVar2 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::empty
                        ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                          *)&RI.Children._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = false;
      if (!bVar2) {
        bVar2 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
                empty(&ParentRI->Ranges);
        bVar1 = false;
        if (!bVar2) {
          TVar3 = DWARFDie::getTag(Die);
          bVar1 = false;
          if (TVar3 == DW_TAG_subprogram) {
            TVar3 = DWARFDie::getTag(&ParentRI->Die);
            bVar1 = TVar3 == DW_TAG_subprogram;
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
      }
      if ((bVar1) && (bVar1 = DieRangeInfo::contains(ParentRI,(DieRangeInfo *)local_e0), !bVar1)) {
        RangesOrError._28_4_ = RangesOrError._28_4_ + 1;
        prVar6 = error(this);
        raw_ostream::operator<<
                  (prVar6,"DIE address ranges are not contained in its parent\'s ranges:");
        dump(this,&ParentRI->Die,0);
        prVar6 = dump(this,Die,2);
        raw_ostream::operator<<(prVar6,'\n');
      }
      iVar8 = DWARFDie::begin(Die);
      __end1.Die.Die = (DWARFDebugInfoEntry *)iVar8.Die.U;
      DVar9 = (DWARFDie)DWARFDie::end(Die);
      while( true ) {
        __end1.Die.U = (DWARFUnit *)DVar9.Die;
        Child.Die = (DWARFDebugInfoEntry *)DVar9.U;
        bVar1 = llvm::operator!=((iterator *)&__end1.Die.Die,(iterator *)&Child.Die);
        if (!bVar1) break;
        pDVar7 = DWARFDie::iterator::operator*((iterator *)&__end1.Die.Die);
        auStack_188 = (undefined1  [8])pDVar7->U;
        Child.U = (DWARFUnit *)pDVar7->Die;
        uVar4 = verifyDieRanges(this,(DWARFDie *)auStack_188,(DieRangeInfo *)local_e0);
        RangesOrError._28_4_ = uVar4 + RangesOrError._28_4_;
        DWARFDie::iterator::operator++((iterator *)&__end1.Die.Die);
        DVar9.Die = (DWARFDebugInfoEntry *)__end1.Die.U;
        DVar9.U = (DWARFUnit *)Child.Die;
      }
      this_local._4_4_ = RangesOrError._28_4_;
      DieRangeInfo::~DieRangeInfo((DieRangeInfo *)local_e0);
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::~vector
                ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 &RI.Children._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      RangesOrError._28_4_ = RangesOrError._28_4_ + 1;
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                 *)local_68);
      consumeError((Error *)local_68);
      Error::~Error((Error *)local_68);
      this_local._4_4_ = RangesOrError._28_4_;
    }
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_50);
  }
  else {
    this_local._4_4_ = RangesOrError._28_4_;
  }
  return this_local._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDieRanges(const DWARFDie &Die,
                                        DieRangeInfo &ParentRI) {
  unsigned NumErrors = 0;

  if (!Die.isValid())
    return NumErrors;

  auto RangesOrError = Die.getAddressRanges();
  if (!RangesOrError) {
    // FIXME: Report the error.
    ++NumErrors;
    llvm::consumeError(RangesOrError.takeError());
    return NumErrors;
  }

  DWARFAddressRangesVector Ranges = RangesOrError.get();
  // Build RI for this DIE and check that ranges within this DIE do not
  // overlap.
  DieRangeInfo RI(Die);

  // TODO support object files better
  //
  // Some object file formats (i.e. non-MachO) support COMDAT.  ELF in
  // particular does so by placing each function into a section.  The DWARF data
  // for the function at that point uses a section relative DW_FORM_addrp for
  // the DW_AT_low_pc and a DW_FORM_data4 for the offset as the DW_AT_high_pc.
  // In such a case, when the Die is the CU, the ranges will overlap, and we
  // will flag valid conflicting ranges as invalid.
  //
  // For such targets, we should read the ranges from the CU and partition them
  // by the section id.  The ranges within a particular section should be
  // disjoint, although the ranges across sections may overlap.  We would map
  // the child die to the entity that it references and the section with which
  // it is associated.  The child would then be checked against the range
  // information for the associated section.
  //
  // For now, simply elide the range verification for the CU DIEs if we are
  // processing an object file.

  if (!IsObjectFile || IsMachOObject || Die.getTag() != DW_TAG_compile_unit) {
    for (auto Range : Ranges) {
      if (!Range.valid()) {
        ++NumErrors;
        error() << "Invalid address range " << Range << "\n";
        continue;
      }

      // Verify that ranges don't intersect.
      const auto IntersectingRange = RI.insert(Range);
      if (IntersectingRange != RI.Ranges.end()) {
        ++NumErrors;
        error() << "DIE has overlapping address ranges: " << Range << " and "
                << *IntersectingRange << "\n";
        break;
      }
    }
  }

  // Verify that children don't intersect.
  const auto IntersectingChild = ParentRI.insert(RI);
  if (IntersectingChild != ParentRI.Children.end()) {
    ++NumErrors;
    error() << "DIEs have overlapping address ranges:";
    dump(Die);
    dump(IntersectingChild->Die) << '\n';
  }

  // Verify that ranges are contained within their parent.
  bool ShouldBeContained = !Ranges.empty() && !ParentRI.Ranges.empty() &&
                           !(Die.getTag() == DW_TAG_subprogram &&
                             ParentRI.Die.getTag() == DW_TAG_subprogram);
  if (ShouldBeContained && !ParentRI.contains(RI)) {
    ++NumErrors;
    error() << "DIE address ranges are not contained in its parent's ranges:";
    dump(ParentRI.Die);
    dump(Die, 2) << '\n';
  }

  // Recursively check children.
  for (DWARFDie Child : Die)
    NumErrors += verifyDieRanges(Child, RI);

  return NumErrors;
}